

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Minefield_Data_PDU::AddSensorType(Minefield_Data_PDU *this,SensorType ST)

{
  KUINT16 *pKVar1;
  iterator __position;
  unsigned_short local_a;
  
  local_a = (unsigned_short)ST;
  __position._M_current =
       (this->m_vui16SensorTypes).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              (&this->m_vui16SensorTypes,__position,&local_a);
  }
  else {
    *__position._M_current = local_a;
    (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 2;
  this->m_ui8NumSensTyp = this->m_ui8NumSensTyp + '\x01';
  return;
}

Assistant:

void Minefield_Data_PDU::AddSensorType( SensorType ST )
{
    m_vui16SensorTypes.push_back( ST );
    m_ui16PDULength += 2; // 16 bit enum. = 2 octets
    ++m_ui8NumSensTyp;
}